

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O0

char * flatcc_json_parser_union_type
                 (flatcc_json_parser_t *ctx,char *buf,char *end,size_t union_index,
                 flatbuffers_voffset_t id,size_t handle,
                 flatcc_json_parser_integral_symbol_f **type_parsers,
                 flatcc_json_parser_union_f *union_parser)

{
  int iVar1;
  char *pcVar2;
  flatcc_builder_union_ref_t uref_00;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  char *line_start;
  int line;
  char *mark;
  flatcc_builder_union_ref_t uref;
  __flatcc_json_parser_union_entry_t *e;
  __flatcc_json_parser_union_frame_t *f;
  size_t handle_local;
  flatbuffers_voffset_t id_local;
  size_t union_index_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  pvVar4 = flatcc_builder_get_user_frame_ptr(ctx->ctx,handle);
  uref = (flatcc_builder_union_ref_t)((long)pvVar4 + union_index * 0x28 + 0x10);
  if (*(char *)((long)uref + 0x14) == '\0') {
    *(undefined1 *)((long)uref + 0x14) = 1;
    end_local = flatcc_json_parser_uint8(ctx,buf,end,(uint8_t *)((long)uref + 0x15));
    if (buf == end_local) {
      end_local = flatcc_json_parser_symbolic_uint8
                            (ctx,end_local,end,type_parsers,(uint8_t *)((long)uref + 0x15));
    }
    if (*(long *)uref == 0) {
      *(long *)((long)pvVar4 + 8) =
           (long)(int)(uint)(*(char *)((long)uref + 0x15) != '\0') + *(long *)((long)pvVar4 + 8);
      ctx_local = (flatcc_json_parser_t *)end_local;
    }
    else {
      if (*(long *)((long)pvVar4 + 8) == 0) {
        __assert_fail("f->union_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_parser.c"
                      ,0x43b,
                      "const char *flatcc_json_parser_union_type(flatcc_json_parser_t *, const char *, const char *, size_t, flatbuffers_voffset_t, size_t, flatcc_json_parser_integral_symbol_f **, flatcc_json_parser_union_f *)"
                     );
      }
      *(long *)((long)pvVar4 + 8) = *(long *)((long)pvVar4 + 8) + -1;
      iVar1 = ctx->line;
      pcVar2 = ctx->line_start;
      ctx->line = *(int *)((long)uref + 0x10);
      ctx->line_start = *(char **)((long)uref + 8);
      mark._0_1_ = *(flatcc_builder_utype_t *)((long)uref + 0x15);
      pcVar5 = (*union_parser)(ctx,*(char **)uref,end,*(uint8_t *)((long)uref + 0x15),
                               (flatcc_builder_ref_t *)((long)&mark + 4));
      ctx_local = (flatcc_json_parser_t *)end;
      if (end != pcVar5) {
        uref_00._1_7_ = mark._1_7_;
        uref_00.type = (flatcc_builder_utype_t)mark;
        iVar3 = flatcc_builder_table_add_union(ctx->ctx,(uint)id,uref_00);
        if (iVar3 == 0) {
          ctx->line = iVar1;
          ctx->line_start = pcVar2;
          ctx_local = (flatcc_json_parser_t *)end_local;
        }
        else {
          ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,end_local,end,0x1c);
        }
      }
    }
  }
  else {
    ctx_local = (flatcc_json_parser_t *)flatcc_json_parser_set_error(ctx,buf,end,0x1c);
  }
  return (char *)ctx_local;
}

Assistant:

const char *flatcc_json_parser_union_type(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, size_t union_index, flatbuffers_voffset_t id,
        size_t handle,
        flatcc_json_parser_integral_symbol_f *type_parsers[],
        flatcc_json_parser_union_f *union_parser)
{
    __flatcc_json_parser_union_frame_t *f = flatcc_builder_get_user_frame_ptr(ctx->ctx, handle);
    __flatcc_json_parser_union_entry_t *e = f->unions + union_index;

    flatcc_builder_union_ref_t uref;
    const char *mark;
    int line;
    const char *line_start;

    if (e->type_present) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    e->type_present = 1;
    buf = flatcc_json_parser_uint8(ctx, (mark = buf), end, &e->type);
    if (mark == buf) {
        buf = flatcc_json_parser_symbolic_uint8(ctx, buf, end, type_parsers, &e->type);
    }
    /* Only count the union if the type is not NONE. */
    if (e->backtrace == 0) {
        f->union_count += e->type != 0;
        return buf;
    }
    FLATCC_ASSERT(f->union_count);
    --f->union_count;
    /*
     * IMPORTANT: we cannot access any value in the frame or entry
     * pointer after calling union parse because it might cause the
     * stack to reallocate. We should read the frame pointer again if
     * needed - we don't but remember it if refactoring code.
     *
     * IMPORTANT 2: Do not assign buf here. We are backtracking.
     */
    line = ctx->line;
    line_start = ctx->line_start;
    ctx->line = e->line;
    ctx->line_start = e->line_start;
    uref.type = e->type;
    if (end == union_parser(ctx, e->backtrace, end, e->type, &uref.value)) {
        return end;
    }
    if (flatcc_builder_table_add_union(ctx->ctx, id, uref)) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_duplicate);
    }
    ctx->line = line;
    ctx->line_start = line_start;
    return buf;
}